

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int wally_witness_program_from_bytes_using_version
              (uchar *bytes,size_t bytes_len,uint8_t witness_version,uint32_t flags,uchar *bytes_out
              ,size_t len,size_t *written)

{
  size_t sVar1;
  int iVar2;
  uchar *puVar3;
  undefined7 in_register_00000011;
  uint flags_00;
  
  if ((int)CONCAT71(in_register_00000011,witness_version) == 0) {
    iVar2 = wally_witness_program_from_bytes(bytes,bytes_len,flags,bytes_out,len,written);
    return iVar2;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar2 = -2;
  if (witness_version < 0x11 && (bytes != (uchar *)0x0 || bytes_len == 0)) {
    flags_00 = flags & 3;
    if ((((written != (size_t *)0x0) && (bytes_len != 0 || flags_00 == 0)) && (len != 0)) &&
       (((bytes_out != (uchar *)0x0 && (flags < 8)) && (flags_00 != 3)))) {
      puVar3 = bytes_out;
      if (3 < flags) {
        if (len < 2) {
          return -2;
        }
        len = len - 1;
        puVar3 = bytes_out + 1;
      }
      *puVar3 = witness_version + 'P';
      iVar2 = wally_script_push_from_bytes(bytes,bytes_len,flags_00,puVar3 + 1,len - 1,written);
      if (iVar2 == 0) {
        sVar1 = *written;
        iVar2 = 0;
        *written = sVar1 + 1;
        if (3 < flags) {
          *bytes_out = (uchar)(sVar1 + 1);
          *written = *written + 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int wally_witness_program_from_bytes_using_version(
    const unsigned char *bytes, size_t bytes_len, uint8_t witness_version,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    int ret;
    unsigned char *p = bytes_out;

    if (witness_version == 0)
        return wally_witness_program_from_bytes(
            bytes, bytes_len, flags, bytes_out, len, written);

    if (written)
        *written = 0;

    if ((bytes_len && !bytes) || (witness_version > 16) ||
        !script_flags_ok(flags, WALLY_SCRIPT_AS_PUSH) ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (flags & ALL_SCRIPT_HASH_FLAGS) {
        if (!bytes_len)
            return WALLY_EINVAL;
    }
    if (flags & WALLY_SCRIPT_AS_PUSH) {
        if (len < 2)
            return WALLY_EINVAL;
        ++bytes_out;
        --len;
    }

    /* Witness version */
    bytes_out[0] = (witness_version == 0) ? 0 : 0x50 + witness_version;
    ret = wally_script_push_from_bytes(bytes, bytes_len,
                                       flags & ~WALLY_SCRIPT_AS_PUSH,
                                       bytes_out + 1, len - 1, written);
    if (ret == WALLY_OK) {
        *written += 1; /* For Witness version byte */
        if (flags & WALLY_SCRIPT_AS_PUSH) {
            *p = *written & 0xff;
            *written += 1; /* For Witness version byte */
        }
    }
    return ret;
}